

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O3

int gost_ec_verify(uchar *dgst,int dgst_len,ECDSA_SIG *sig,EC_KEY *ec)

{
  int iVar1;
  int iVar2;
  EC_GROUP *pEVar3;
  BN_CTX *ctx;
  BIGNUM *order;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  BIGNUM *ret;
  EC_POINT *q;
  EC_POINT *r;
  int reason;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BIGNUM *sig_r;
  BIGNUM *sig_s;
  BIGNUM *local_98;
  BIGNUM *local_90;
  EC_GROUP *local_88;
  BIGNUM *local_80;
  int local_74;
  BIGNUM *local_70;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  BIGNUM *local_50;
  uchar *local_48;
  ECDSA_SIG *local_40;
  EC_KEY *local_38;
  
  if (ec == (EC_KEY *)0x0) {
    pEVar3 = (EC_GROUP *)0x0;
  }
  else {
    pEVar3 = EC_KEY_get0_group((EC_KEY *)ec);
  }
  local_80 = (BIGNUM *)0x0;
  local_98 = (BIGNUM *)0x0;
  if (((dgst == (uchar *)0x0) || (sig == (ECDSA_SIG *)0x0)) || (pEVar3 == (EC_GROUP *)0x0)) {
    OPENSSL_die("assertion failed: dgst != NULL && sig != NULL && group != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                ,0x152);
  }
  ctx = BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    ERR_GOST_error(0x6e,0xc0100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,0x155);
    return 0;
  }
  local_88 = pEVar3;
  local_74 = dgst_len;
  local_48 = dgst;
  local_40 = sig;
  local_38 = ec;
  BN_CTX_start(ctx);
  order = BN_CTX_get(ctx);
  local_90 = BN_CTX_get(ctx);
  pBVar4 = BN_CTX_get(ctx);
  pBVar5 = BN_CTX_get(ctx);
  pBVar6 = BN_CTX_get(ctx);
  pBVar7 = BN_CTX_get(ctx);
  pBVar8 = BN_CTX_get(ctx);
  ret = BN_CTX_get(ctx);
  auVar10._0_4_ = -(uint)((int)order == 0);
  auVar10._4_4_ = -(uint)((int)((ulong)order >> 0x20) == 0);
  auVar10._8_4_ = -(uint)((int)local_90 == 0);
  auVar10._12_4_ = -(uint)((int)((ulong)local_90 >> 0x20) == 0);
  auVar15._4_4_ = auVar10._0_4_;
  auVar15._0_4_ = auVar10._4_4_;
  auVar15._8_4_ = auVar10._12_4_;
  auVar15._12_4_ = auVar10._8_4_;
  auVar11._0_4_ = -(uint)((int)pBVar4 == 0);
  auVar11._4_4_ = -(uint)((int)((ulong)pBVar4 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)pBVar5 == 0);
  auVar11._12_4_ = -(uint)((int)((ulong)pBVar5 >> 0x20) == 0);
  auVar16._4_4_ = auVar11._0_4_;
  auVar16._0_4_ = auVar11._4_4_;
  auVar16._8_4_ = auVar11._12_4_;
  auVar16._12_4_ = auVar11._8_4_;
  auVar16 = packssdw(auVar15 & auVar10,auVar16 & auVar11);
  auVar13._0_4_ = -(uint)((int)pBVar6 == 0);
  auVar13._4_4_ = -(uint)((int)((ulong)pBVar6 >> 0x20) == 0);
  auVar13._8_4_ = -(uint)((int)pBVar7 == 0);
  auVar13._12_4_ = -(uint)((int)((ulong)pBVar7 >> 0x20) == 0);
  auVar9._4_4_ = auVar13._0_4_;
  auVar9._0_4_ = auVar13._4_4_;
  auVar9._8_4_ = auVar13._12_4_;
  auVar9._12_4_ = auVar13._8_4_;
  auVar14._0_4_ = -(uint)((int)pBVar8 == 0);
  auVar14._4_4_ = -(uint)((int)((ulong)pBVar8 >> 0x20) == 0);
  auVar14._8_4_ = -(uint)((int)ret == 0);
  auVar14._12_4_ = -(uint)((int)((ulong)ret >> 0x20) == 0);
  auVar12._4_4_ = auVar14._0_4_;
  auVar12._0_4_ = auVar14._4_4_;
  auVar12._8_4_ = auVar14._12_4_;
  auVar12._12_4_ = auVar14._8_4_;
  auVar10 = packssdw(auVar9 & auVar13,auVar12 & auVar14);
  auVar10 = packssdw(auVar16,auVar10);
  if ((((((((auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar10[0xf] < '\0') {
    ERR_GOST_error(0x6e,0xc0100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,0x163);
    iVar1 = 0;
    pBVar4 = (BIGNUM *)0x0;
    goto LAB_00124bf0;
  }
  local_70 = pBVar8;
  local_68 = pBVar7;
  local_60 = pBVar5;
  local_58 = pBVar6;
  local_50 = pBVar4;
  q = EC_KEY_get0_public_key((EC_KEY *)local_38);
  if ((q == (EC_POINT *)0x0) || (iVar1 = EC_GROUP_get_order(local_88,order,ctx), iVar1 == 0)) {
    iVar2 = 0xc0103;
    iVar1 = 0x169;
  }
  else {
    ECDSA_SIG_get0(local_40,&local_98,&local_80);
    iVar1 = BN_is_zero(local_80);
    if (((iVar1 == 0) && (iVar1 = BN_is_zero(local_98), iVar1 == 0)) &&
       ((iVar1 = BN_is_negative(local_80), iVar1 == 0 &&
        (((iVar1 = BN_is_negative(local_98), iVar1 == 0 &&
          (iVar1 = BN_ucmp(local_80,order), iVar1 < 0)) &&
         (iVar1 = BN_ucmp(local_98,order), iVar1 < 0)))))) {
      if ((local_74 != 0x20) && (local_74 != 0x40)) {
        OPENSSL_die("assertion failed: dgst_len == 32 || dgst_len == 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                    ,0x176);
      }
      iVar1 = 0;
      pBVar4 = (BIGNUM *)BN_lebin2bn(local_48,local_74,0);
      if ((pBVar4 == (BIGNUM *)0x0) ||
         (iVar2 = BN_div((BIGNUM *)0x0,local_90,pBVar4,order,ctx), iVar2 == 0)) {
        ERR_GOST_error(0x6e,0xc0103,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                       ,0x179);
        goto LAB_00124bf0;
      }
      iVar1 = BN_is_zero(local_90);
      if ((iVar1 == 0) || (iVar1 = BN_set_word(local_90,1), iVar1 != 0)) {
        pBVar5 = BN_mod_inverse(ret,local_90,order,ctx);
        if ((pBVar5 != (BIGNUM *)0x0) &&
           (((iVar1 = BN_mod_mul(local_50,local_80,pBVar5,order,ctx), iVar1 != 0 &&
             (iVar1 = BN_sub(local_58,order,local_98), iVar1 != 0)) &&
            (iVar1 = BN_mod_mul(local_60,local_58,pBVar5,order,ctx), iVar1 != 0)))) {
          r = EC_POINT_new(local_88);
          if (r == (EC_POINT *)0x0) {
            ERR_GOST_error(0x6e,0xc0100,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,0x197);
            iVar1 = 0;
            goto LAB_00124bf0;
          }
          iVar1 = gost_ec_point_mul((EC_GROUP *)local_88,(EC_POINT *)r,(BIGNUM *)local_50,
                                    (EC_POINT *)q,(BIGNUM *)local_60,(BN_CTX *)ctx);
          if (iVar1 == 0) {
            iVar2 = 0x80010;
            iVar1 = 0x19b;
LAB_00124e56:
            ERR_GOST_error(0x6e,iVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,iVar1);
            iVar1 = 0;
          }
          else {
            iVar1 = EC_POINT_get_affine_coordinates(local_88,r,local_68,0,ctx);
            if (iVar1 == 0) {
              reason = 0x80010;
              iVar2 = 0x19f;
            }
            else {
              iVar1 = BN_div((BIGNUM *)0x0,local_70,local_68,order,ctx);
              if (iVar1 != 0) {
                iVar1 = BN_cmp(local_70,local_98);
                if (iVar1 != 0) {
                  iVar2 = 0x7f;
                  iVar1 = 0x1ae;
                  goto LAB_00124e56;
                }
                iVar1 = 1;
                goto LAB_00124e93;
              }
              reason = 0xc0103;
              iVar2 = 0x1a3;
            }
            iVar1 = 0;
            ERR_GOST_error(0x6e,reason,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,iVar2);
          }
LAB_00124e93:
          EC_POINT_free(r);
          goto LAB_00124bf0;
        }
        iVar1 = 0x18a;
      }
      else {
        iVar1 = 0x183;
      }
      ERR_GOST_error(0x6e,0xc0103,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                     ,iVar1);
      iVar1 = 0;
      goto LAB_00124bf0;
    }
    iVar2 = 0x80;
    iVar1 = 0x172;
  }
  ERR_GOST_error(0x6e,iVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                 ,iVar1);
  iVar1 = 0;
  pBVar4 = (BIGNUM *)0x0;
LAB_00124bf0:
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  if (pBVar4 != (BIGNUM *)0x0) {
    BN_free(pBVar4);
  }
  return iVar1;
}

Assistant:

int gost_ec_verify(const unsigned char *dgst, int dgst_len,
                   ECDSA_SIG *sig, EC_KEY *ec)
{
    BN_CTX *ctx;
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    BIGNUM *order;
    BIGNUM *md = NULL, *e = NULL, *R = NULL, *v = NULL, *z1 = NULL, *z2 = NULL;
    const BIGNUM *sig_s = NULL, *sig_r = NULL;
    BIGNUM *X = NULL, *tmp = NULL;
    EC_POINT *C = NULL;
    const EC_POINT *pub_key = NULL;
    int ok = 0;

    OPENSSL_assert(dgst != NULL && sig != NULL && group != NULL);

    if (!(ctx = BN_CTX_new())) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    order = BN_CTX_get(ctx);
    e = BN_CTX_get(ctx);
    z1 = BN_CTX_get(ctx);
    z2 = BN_CTX_get(ctx);
    tmp = BN_CTX_get(ctx);
    X = BN_CTX_get(ctx);
    R = BN_CTX_get(ctx);
    v = BN_CTX_get(ctx);
    if (!order || !e || !z1 || !z2 || !tmp || !X || !R || !v) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    pub_key = EC_KEY_get0_public_key(ec);
    if (!pub_key || !EC_GROUP_get_order(group, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    ECDSA_SIG_get0(sig, &sig_r, &sig_s);

    if (BN_is_zero(sig_s) || BN_is_zero(sig_r) ||
        BN_is_negative(sig_s) || BN_is_negative(sig_r) ||
        BN_ucmp(sig_s, order) >= 0 || BN_ucmp(sig_r, order) >= 0) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, GOST_R_SIGNATURE_PARTS_GREATER_THAN_Q);
        goto err;
    }

    OPENSSL_assert(dgst_len == 32 || dgst_len == 64);
    md = BN_lebin2bn(dgst, dgst_len, NULL);
    if (!md || !BN_mod(e, md, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "digest as bignum: ");
    BN_print_fp(stderr, md);
    fprintf(stderr, "\ndigest mod q: ");
    BN_print_fp(stderr, e);
#endif
    if (BN_is_zero(e) && !BN_one(e)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    v = BN_mod_inverse(v, e, order, ctx);
    if (!v || !BN_mod_mul(z1, sig_s, v, order, ctx)
        || !BN_sub(tmp, order, sig_r)
        || !BN_mod_mul(z2, tmp, v, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "\nInverted digest value: ");
    BN_print_fp(stderr, v);
    fprintf(stderr, "\nz1: ");
    BN_print_fp(stderr, z1);
    fprintf(stderr, "\nz2: ");
    BN_print_fp(stderr, z2);
#endif
    C = EC_POINT_new(group);
    if (!C) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    if (!gost_ec_point_mul(group, C, z1, pub_key, z2, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_EC_LIB);
        goto err;
    }
    if (!EC_POINT_get_affine_coordinates(group, C, X, NULL, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_EC_LIB);
        goto err;
    }
    if (!BN_mod(R, X, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "\nX=");
    BN_print_fp(stderr, X);
    fprintf(stderr, "\nX mod q=");
    BN_print_fp(stderr, R);
    fprintf(stderr, "\n");
#endif
    if (BN_cmp(R, sig_r) != 0) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, GOST_R_SIGNATURE_MISMATCH);
    } else {
        ok = 1;
    }
 err:
    if (C)
        EC_POINT_free(C);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    if (md)
        BN_free(md);
    return ok;
}